

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# were.c
# Opt level: O1

void were_change(monst *mon)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  
  uVar3 = mon->data->mflags2;
  if ((uVar3 & 4) == 0) {
    return;
  }
  if ((uVar3 & 8) == 0) {
    uVar3 = mt_random();
    if (((0x8888888 < (uVar3 * -0x11111111 >> 1 | (uint)((uVar3 * -0x11111111 & 1) != 0) << 0x1f))
        && (u.uprops[0x17].intrinsic == 0)) && (u.uprops[0x17].extrinsic == 0)) {
      return;
    }
    new_were(mon);
    return;
  }
  if (u.uprops[0x17].extrinsic != 0 || u.uprops[0x17].intrinsic != 0) {
    return;
  }
  iVar4 = night();
  uVar3 = 0x1e;
  if (flags.moonphase == 4) {
    uVar3 = 3;
  }
  uVar5 = 0x32;
  if (flags.moonphase == 4) {
    uVar5 = 10;
  }
  if (iVar4 != 0) {
    uVar5 = uVar3;
  }
  uVar3 = mt_random();
  if (uVar3 % uVar5 != 0) {
    return;
  }
  new_were(mon);
  if (flags.soundok == '\0') {
    return;
  }
  if (mon->wormno == '\0') {
    if (((viz_array[mon->my][mon->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
          || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
        (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mon->my][mon->mx] & 1U) == 0 || ((mon->data->mflags3 & 0x200) == 0))))))))
    goto LAB_00285ba8;
  }
  else {
    bVar2 = worm_known(level,mon);
    if (bVar2 == '\0') goto LAB_00285ba8;
  }
  uVar3 = *(uint *)&mon->field_0x60;
  if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar3 & 0x280) != 0) goto LAB_00285ba8;
  }
  else if (((uVar3 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00285ba8;
  if ((u._1052_1_ & 0x20) == 0) {
    return;
  }
LAB_00285ba8:
  if (mon->mnum == 0x17) {
    bVar1 = false;
    pcVar6 = "wolf";
  }
  else if (mon->mnum == 0x11) {
    pcVar6 = "jackal";
    bVar1 = false;
  }
  else {
    bVar1 = true;
    pcVar6 = (char *)0x0;
  }
  if (bVar1) {
    return;
  }
  You_hear("a %s howling at the moon.",pcVar6);
  return;
}

Assistant:

void were_change(struct monst *mon)
{
	if (!is_were(mon->data))
	    return;

	if (is_human(mon->data)) {
	    if (!Protection_from_shape_changers &&
		!rn2(night() ? (flags.moonphase == FULL_MOON ?  3 : 30)
			     : (flags.moonphase == FULL_MOON ? 10 : 50))) {
		new_were(mon);		/* change into animal form */
		if (flags.soundok && !canseemon(level, mon)) {
		    const char *howler;

		    switch (mon->mnum) {
		    case PM_WEREWOLF:	howler = "wolf";    break;
		    case PM_WEREJACKAL: howler = "jackal";  break;
		    default:		howler = NULL; break;
		    }
		    if (howler)
			You_hear("a %s howling at the moon.", howler);
		}
	    }
	} else if (!rn2(30) || Protection_from_shape_changers) {
	    new_were(mon);		/* change back into human form */
	}
}